

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

DataLocationUsage * __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::add<>
          (Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this)

{
  DataLocationUsage *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar2;
  
  pRVar2 = (this->builder).pos;
  if (pRVar2 == (this->builder).endPtr) {
    grow(this,0);
    pRVar2 = (this->builder).pos;
  }
  pRVar2->isUsed = false;
  (pRVar2->holes).holes[0] = '\0';
  (pRVar2->holes).holes[1] = '\0';
  (pRVar2->holes).holes[2] = '\0';
  (pRVar2->holes).holes[3] = '\0';
  (pRVar2->holes).holes[4] = '\0';
  (pRVar2->holes).holes[5] = '\0';
  pDVar1 = (this->builder).pos;
  (this->builder).pos = pDVar1 + 1;
  return pDVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }